

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O3

void Js::AddPartToPartsArray
               (ScriptContext *scriptContext,JavascriptArray *arr,int arrIndex,char16 *src,int start
               ,int end,JavascriptString *partType)

{
  JavascriptString *newValue;
  DynamicObject *instance;
  
  newValue = JavascriptString::NewCopyBuffer(src + start,end - start,scriptContext);
  instance = JavascriptLibrary::CreateObject
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary,false,0);
  JavascriptOperators::InitProperty
            (&instance->super_RecyclableObject,0xf6,partType,PropertyOperation_None);
  JavascriptOperators::InitProperty
            (&instance->super_RecyclableObject,0x197,newValue,PropertyOperation_None);
  (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
            (arr,(ulong)(uint)arrIndex,instance,0);
  return;
}

Assistant:

static void AddPartToPartsArray(ScriptContext *scriptContext, JavascriptArray *arr, int arrIndex, const char16 *src, int start, int end, JavascriptString *partType)
    {
        JavascriptString *partValue = JavascriptString::NewCopyBuffer(
            src + start,
            end - start,
            scriptContext
        );

        DynamicObject* part = scriptContext->GetLibrary()->CreateObject();
        JavascriptOperators::InitProperty(part, PropertyIds::type, partType);
        JavascriptOperators::InitProperty(part, PropertyIds::value, partValue);

        arr->SetItem(arrIndex, part, PropertyOperationFlags::PropertyOperation_None);
    }